

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_init_dec(opj_mqc_t *mqc,uchar *bp,int len)

{
  uint uVar1;
  
  mqc->curctx = mqc->ctxs;
  mqc->start = bp;
  mqc->end = bp + len;
  mqc->bp = bp;
  if (len == 0) {
    uVar1 = 0xff0000;
  }
  else {
    uVar1 = (uint)*bp << 0x10;
  }
  mqc->c = uVar1;
  mqc_bytein(mqc);
  mqc->c = mqc->c << 7;
  mqc->ct = mqc->ct - 7;
  mqc->a = 0x8000;
  return;
}

Assistant:

void mqc_init_dec(opj_mqc_t *mqc, unsigned char *bp, int len) {
	mqc_setcurctx(mqc, 0);
	mqc->start = bp;
	mqc->end = bp + len;
	mqc->bp = bp;
	if (len==0) mqc->c = 0xff << 16;
	else mqc->c = *mqc->bp << 16;

#ifdef MQC_PERF_OPT
	{
		unsigned int c;
		unsigned int *ip;
		unsigned char *end = mqc->end - 1;
		mqc->buffer = opj_realloc(mqc->buffer, (len + 1) * sizeof(unsigned int));
		ip = (unsigned int *) mqc->buffer;

		while (bp < end) {
			c = *(bp + 1);
			if (*bp == 0xff) {
				if (c > 0x8f) {
					break;
				} else {
					*ip = 0x00000017 | (c << 9);
				}
			} else {
				*ip = 0x00000018 | (c << 8);
			}
			bp++;
			ip++;
		}

		/* Handle last byte of data */
		c = 0xff;
		if (*bp == 0xff) {
			*ip = 0x0000ff18;
		} else {
			bp++;
			*ip = 0x00000018 | (c << 8);
		}
		ip++;

		*ip = 0x0000ff08;
		mqc->bp = mqc->buffer;
	}
#endif
	mqc_bytein(mqc);
	mqc->c <<= 7;
	mqc->ct -= 7;
	mqc->a = 0x8000;
}